

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_linux.cpp
# Opt level: O2

void parseUUID(char *uuid,uchar *buffer_out,uint out_size)

{
  char cVar1;
  int iVar2;
  size_t __size;
  uint uVar3;
  uint uVar4;
  void *pvVar5;
  ulong uVar6;
  uchar cur_character;
  void *local_40;
  uchar *local_38;
  
  __size = strlen(uuid);
  local_40 = calloc(1,__size);
  buffer_out[0] = '\0';
  buffer_out[1] = '\0';
  buffer_out[2] = '\0';
  buffer_out[3] = '\0';
  buffer_out[4] = '\0';
  buffer_out[5] = '\0';
  buffer_out[6] = '\0';
  buffer_out[7] = '\0';
  uVar3 = 0;
  uVar4 = 0;
  local_38 = buffer_out;
  while( true ) {
    uVar6 = (ulong)uVar3;
    if (__size <= uVar4) break;
    cVar1 = uuid[uVar4];
    iVar2 = isxdigit((int)cVar1);
    if (iVar2 != 0) {
      *(char *)((long)local_40 + uVar6) = cVar1;
      uVar3 = uVar3 + 1;
    }
    uVar4 = uVar4 + 1;
  }
  if ((uVar3 & 1) != 0) {
    uVar3 = uVar3 + 1;
    *(undefined1 *)((long)local_40 + uVar6) = 0x30;
  }
  *(undefined1 *)((long)local_40 + (ulong)uVar3) = 0;
  pvVar5 = local_40;
  for (uVar6 = 0; uVar3 >> 1 != uVar6; uVar6 = uVar6 + 1) {
    __isoc99_sscanf(pvVar5,"%2hhx",&cur_character);
    local_38[(uint)uVar6 & 7] = local_38[(uint)uVar6 & 7] ^ cur_character;
    pvVar5 = (void *)((long)pvVar5 + 2);
  }
  free(local_40);
  return;
}

Assistant:

static void parseUUID(const char *uuid, unsigned char *buffer_out, unsigned int out_size) {
	unsigned int i, j;
	char *hexuuid;
	unsigned char cur_character;
	// remove characters not in hex set
	size_t len = strlen(uuid);
	hexuuid = (char *)malloc(sizeof(char) * len);
	memset(buffer_out, 0, out_size);
	memset(hexuuid, 0, sizeof(char) * len);

	for (i = 0, j = 0; i < len; i++) {
		if (isxdigit(uuid[i])) {
			hexuuid[j] = uuid[i];
			j++;
		} else {
			// skip
			continue;
		}
	}
	if (j % 2 == 1) {
		hexuuid[j++] = '0';
	}
	hexuuid[j] = '\0';
	for (i = 0; i < j / 2; i++) {
		sscanf(&hexuuid[i * 2], "%2hhx", &cur_character);
		buffer_out[i % out_size] = buffer_out[i % out_size] ^ cur_character;
	}

	free(hexuuid);
}